

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O0

void Ssw_FramesConstrainNode
               (Ssw_Man_t *p,Aig_Man_t *pFrames,Aig_Man_t *pAig,Aig_Obj_t *pObj,int iFrame,
               int fTwoPos)

{
  int c;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p0;
  Aig_Obj_t *p_00;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pObjReprNew;
  Aig_Obj_t *pObjRepr;
  Aig_Obj_t *pObjNew2;
  Aig_Obj_t *pObjNew;
  int fTwoPos_local;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  Aig_Man_t *pFrames_local;
  Ssw_Man_t *p_local;
  
  pAVar1 = Aig_ObjRepr(pAig,pObj);
  if (pAVar1 != (Aig_Obj_t *)0x0) {
    p->nConstrTotal = p->nConstrTotal + 1;
    if (pObj->Id <= pAVar1->Id) {
      __assert_fail("pObjRepr->Id < pObj->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswAig.c"
                    ,0x61,
                    "void Ssw_FramesConstrainNode(Ssw_Man_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int, int)"
                   );
    }
    p0 = Ssw_ObjFrame(p,pObj,iFrame);
    p_00 = Ssw_ObjFrame(p,pAVar1,iFrame);
    if (((uint)(*(ulong *)&pObj->field_0x18 >> 3) & 1) ==
        ((uint)(*(ulong *)&pAVar1->field_0x18 >> 3) & 1)) {
      pAVar2 = Aig_Not(p_00);
      pAVar3 = p_00;
      if (p0 == pAVar2) {
        __assert_fail("pObjNew != Aig_Not(pObjReprNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswAig.c"
                      ,0x69,
                      "void Ssw_FramesConstrainNode(Ssw_Man_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int, int)"
                     );
      }
    }
    else {
      if (p0 == p_00) {
        __assert_fail("pObjNew != pObjReprNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswAig.c"
                      ,0x6f,
                      "void Ssw_FramesConstrainNode(Ssw_Man_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int, int)"
                     );
      }
      pAVar3 = Aig_Not(p_00);
    }
    if (p0 != pAVar3) {
      p->nConstrReduced = p->nConstrReduced + 1;
      pAVar1 = Aig_NotCond(p_00,(uint)(*(ulong *)&pObj->field_0x18 >> 3) & 1 ^
                                (uint)(*(ulong *)&pAVar1->field_0x18 >> 3) & 1);
      Ssw_ObjSetFrame(p,pObj,iFrame,pAVar1);
      if (fTwoPos == 0) {
        pAVar1 = Aig_Exor(pFrames,p0,pAVar1);
        c = Aig_ObjPhaseReal(pAVar1);
        pAVar1 = Aig_NotCond(pAVar1,c);
        Aig_ObjCreateCo(pFrames,pAVar1);
      }
      else {
        Aig_ObjCreateCo(pFrames,pAVar1);
        Aig_ObjCreateCo(pFrames,p0);
      }
    }
  }
  return;
}

Assistant:

static inline void Ssw_FramesConstrainNode( Ssw_Man_t * p, Aig_Man_t * pFrames, Aig_Man_t * pAig, Aig_Obj_t * pObj, int iFrame, int fTwoPos )
{
    Aig_Obj_t * pObjNew, * pObjNew2, * pObjRepr, * pObjReprNew, * pMiter;
    // skip nodes without representative
    pObjRepr = Aig_ObjRepr(pAig, pObj);
    if ( pObjRepr == NULL )
        return;
    p->nConstrTotal++;
    assert( pObjRepr->Id < pObj->Id );
    // get the new node
    pObjNew = Ssw_ObjFrame( p, pObj, iFrame );
    // get the new node of the representative
    pObjReprNew = Ssw_ObjFrame( p, pObjRepr, iFrame );
    // if this is the same node, no need to add constraints
    if ( pObj->fPhase == pObjRepr->fPhase )
    {
        assert( pObjNew != Aig_Not(pObjReprNew) );
        if ( pObjNew == pObjReprNew )
            return;
    }
    else
    {
        assert( pObjNew != pObjReprNew );
        if ( pObjNew == Aig_Not(pObjReprNew) )
            return;
    }
    p->nConstrReduced++;
    // these are different nodes - perform speculative reduction
    pObjNew2 = Aig_NotCond( pObjReprNew, pObj->fPhase ^ pObjRepr->fPhase );
    // set the new node
    Ssw_ObjSetFrame( p, pObj, iFrame, pObjNew2 );
    // add the constraint
    if ( fTwoPos )
    {
        Aig_ObjCreateCo( pFrames, pObjNew2 );
        Aig_ObjCreateCo( pFrames, pObjNew );
    }
    else
    {
        pMiter = Aig_Exor( pFrames, pObjNew, pObjNew2 );
        Aig_ObjCreateCo( pFrames, Aig_NotCond(pMiter, Aig_ObjPhaseReal(pMiter)) );
    }
}